

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Integrator.cpp
# Opt level: O1

void __thiscall iDynTree::optimalcontrol::integrators::Integrator::Integrator(Integrator *this)

{
  IntegratorInfoData *this_00;
  shared_ptr<iDynTree::optimalcontrol::integrators::IntegratorInfoData> local_30;
  
  this->_vptr_Integrator = (_func_int **)&PTR__Integrator_0019a970;
  this->m_dTmax = 0.0;
  (this->m_dynamicalSystem_ptr).
  super___shared_ptr<iDynTree::optimalcontrol::DynamicalSystem,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->m_dynamicalSystem_ptr).
  super___shared_ptr<iDynTree::optimalcontrol::DynamicalSystem,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->m_solution).
  super__Vector_base<iDynTree::optimalcontrol::integrators::SolutionElement,_std::allocator<iDynTree::optimalcontrol::integrators::SolutionElement>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_solution).
  super__Vector_base<iDynTree::optimalcontrol::integrators::SolutionElement,_std::allocator<iDynTree::optimalcontrol::integrators::SolutionElement>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_solution).
  super__Vector_base<iDynTree::optimalcontrol::integrators::SolutionElement,_std::allocator<iDynTree::optimalcontrol::integrators::SolutionElement>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this_00 = (IntegratorInfoData *)operator_new(0x30);
  IntegratorInfoData::IntegratorInfoData(this_00);
  (this->m_infoData).
  super___shared_ptr<iDynTree::optimalcontrol::integrators::IntegratorInfoData,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr = this_00;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<iDynTree::optimalcontrol::integrators::IntegratorInfoData*>
            (&(this->m_infoData).
              super___shared_ptr<iDynTree::optimalcontrol::integrators::IntegratorInfoData,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount,this_00);
  local_30.
  super___shared_ptr<iDynTree::optimalcontrol::integrators::IntegratorInfoData,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr = (this->m_infoData).
            super___shared_ptr<iDynTree::optimalcontrol::integrators::IntegratorInfoData,_(__gnu_cxx::_Lock_policy)2>
            ._M_ptr;
  local_30.
  super___shared_ptr<iDynTree::optimalcontrol::integrators::IntegratorInfoData,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi =
       (this->m_infoData).
       super___shared_ptr<iDynTree::optimalcontrol::integrators::IntegratorInfoData,_(__gnu_cxx::_Lock_policy)2>
       ._M_refcount._M_pi;
  if (local_30.
      super___shared_ptr<iDynTree::optimalcontrol::integrators::IntegratorInfoData,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_30.
       super___shared_ptr<iDynTree::optimalcontrol::integrators::IntegratorInfoData,_(__gnu_cxx::_Lock_policy)2>
       ._M_refcount._M_pi)->_M_use_count =
           (local_30.
            super___shared_ptr<iDynTree::optimalcontrol::integrators::IntegratorInfoData,_(__gnu_cxx::_Lock_policy)2>
            ._M_refcount._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_30.
       super___shared_ptr<iDynTree::optimalcontrol::integrators::IntegratorInfoData,_(__gnu_cxx::_Lock_policy)2>
       ._M_refcount._M_pi)->_M_use_count =
           (local_30.
            super___shared_ptr<iDynTree::optimalcontrol::integrators::IntegratorInfoData,_(__gnu_cxx::_Lock_policy)2>
            ._M_refcount._M_pi)->_M_use_count + 1;
    }
  }
  IntegratorInfo::IntegratorInfo(&this->m_info,&local_30);
  if (local_30.
      super___shared_ptr<iDynTree::optimalcontrol::integrators::IntegratorInfoData,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_30.
               super___shared_ptr<iDynTree::optimalcontrol::integrators::IntegratorInfoData,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  return;
}

Assistant:

Integrator::Integrator()
            : m_dTmax(0)
            , m_dynamicalSystem_ptr(nullptr)
            , m_infoData(new IntegratorInfoData)
            , m_info(m_infoData)
            {
            }